

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvncclient.cpp
# Opt level: O0

void __thiscall QVncClient::setEncodings(QVncClient *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  QVncClient *s;
  undefined8 in_RCX;
  void *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  qint32 enc_1;
  QRfbSetEncodings enc;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QVncClient *in_stack_ffffffffffffff28;
  QRfbRawEncoder *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  QVncScreen *in_stack_ffffffffffffff40;
  int local_ac;
  char local_a0 [32];
  char local_80 [32];
  char local_60 [32];
  uint32_t local_40;
  QRfbSetEncodings local_3a;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3a.count = 0xaaaa;
  if (((*(int *)(in_RDI + 0x58) == 0) &&
      (uVar3 = QRfbSetEncodings::read
                         (&local_3a,(int)*(undefined8 *)(in_RDI + 0x18),in_RDX,
                          CONCAT62((int6)((ulong)in_RCX >> 0x10),0xaaaa)), (uVar3 & 1) != 0)) &&
     (*(uint *)(in_RDI + 0x58) = (uint)local_3a.count, *(int *)(in_RDI + 0x58) == 0)) {
    *(undefined1 *)(in_RDI + 0x2d) = 0;
  }
  if (*(long *)(in_RDI + 0x20) != 0) {
    in_stack_ffffffffffffff40 = *(QVncScreen **)(in_RDI + 0x20);
    if (in_stack_ffffffffffffff40 != (QVncScreen *)0x0) {
      (**(code **)(*(long *)&in_stack_ffffffffffffff40->super_QFbScreen + 8))();
    }
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  if ((*(int *)(in_RDI + 0x58) != 0) &&
     (uVar2 = (**(code **)(**(long **)(in_RDI + 0x18) + 0xa0))(),
     (ulong)((long)*(int *)(in_RDI + 0x58) << 2) <= (ulong)uVar2)) {
    for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x58); local_ac = local_ac + 1) {
      local_40 = 0xaaaaaaaa;
      QIODevice::read(*(char **)(in_RDI + 0x18),(longlong)&local_40);
      local_40 = ntohl(local_40);
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      lcVnc();
      anon_unknown.dwarf_45640::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff30,
                 (QLoggingCategory *)in_stack_ffffffffffffff28);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_45640::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x115664);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_ffffffffffffff40,
                   (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(char *)in_stack_ffffffffffffff28
                   ,(char *)0x11567a);
        QMessageLogger::debug(local_60,"QVncServer::setEncodings: %d",(ulong)local_40);
        local_10 = local_10 & 0xffffffffffffff00;
      }
      in_stack_ffffffffffffff3c = local_40;
      if (local_40 == 0xffffff11) {
        *(byte *)(in_RDI + 0x60) = *(byte *)(in_RDI + 0x60) & 0xdf | 0x20;
        QVncServer::screen(*(QVncServer **)(in_RDI + 0x10));
        QVncScreen::enableClientCursor
                  (in_stack_ffffffffffffff40,
                   (QVncClient *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      else if (local_40 == 0xffffff21) {
        *(byte *)(in_RDI + 0x60) = *(byte *)(in_RDI + 0x60) & 0xbf | 0x40;
      }
      else if (local_40 == 0) {
        if (*(long *)(in_RDI + 0x20) == 0) {
          in_stack_ffffffffffffff30 = (QRfbRawEncoder *)operator_new(0x28);
          QRfbRawEncoder::QRfbRawEncoder(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          *(QRfbRawEncoder **)(in_RDI + 0x20) = in_stack_ffffffffffffff30;
          local_28 = 0xaaaaaaaaaaaaaaaa;
          local_20 = 0xaaaaaaaaaaaaaaaa;
          lcVnc();
          anon_unknown.dwarf_45640::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff30,
                     (QLoggingCategory *)in_stack_ffffffffffffff28);
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
            anon_unknown.dwarf_45640::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1157ac);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_ffffffffffffff40,
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                       (char *)in_stack_ffffffffffffff28,(char *)0x1157c2);
            QMessageLogger::debug(local_80,"QVncServer::setEncodings: using raw");
            local_20 = local_20 & 0xffffffffffffff00;
          }
        }
      }
      else if (local_40 == 1) {
        *(byte *)(in_RDI + 0x60) = *(byte *)(in_RDI + 0x60) & 0xfe | 1;
      }
      else if (local_40 == 2) {
        *(byte *)(in_RDI + 0x60) = *(byte *)(in_RDI + 0x60) & 0xfd | 2;
      }
      else if (local_40 == 4) {
        *(byte *)(in_RDI + 0x60) = *(byte *)(in_RDI + 0x60) & 0xfb | 4;
      }
      else if (local_40 == 5) {
        *(byte *)(in_RDI + 0x60) = *(byte *)(in_RDI + 0x60) & 0xf7 | 8;
      }
      else if (local_40 == 0x10) {
        *(byte *)(in_RDI + 0x60) = *(byte *)(in_RDI + 0x60) & 0xef | 0x10;
      }
    }
    *(undefined1 *)(in_RDI + 0x2d) = 0;
    *(undefined4 *)(in_RDI + 0x58) = 0;
  }
  if (*(long *)(in_RDI + 0x20) == 0) {
    s = (QVncClient *)operator_new(0x28);
    QRfbRawEncoder::QRfbRawEncoder(in_stack_ffffffffffffff30,s);
    *(QVncClient **)(in_RDI + 0x20) = s;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    lcVnc();
    anon_unknown.dwarf_45640::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff30,
               (QLoggingCategory *)s);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
      anon_unknown.dwarf_45640::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11593f);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffff40,
                 (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(char *)s,(char *)0x115955);
      QMessageLogger::debug(local_a0,"QVncServer::setEncodings: fallback using raw");
      local_30 = local_30 & 0xffffffffffffff00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVncClient::setEncodings()
{
    QRfbSetEncodings enc;

    if (!m_encodingsPending && enc.read(m_clientSocket)) {
        m_encodingsPending = enc.count;
        if (!m_encodingsPending)
            m_handleMsg = false;
    }

    if (m_encoder) {
        delete m_encoder;
        m_encoder = nullptr;
    }

    enum Encodings {
        Raw = 0,
        CopyRect = 1,
        RRE = 2,
        CoRRE = 4,
        Hextile = 5,
        ZRLE = 16,
        Cursor = -239,
        DesktopSize = -223
    };

    if (m_encodingsPending && (unsigned)m_clientSocket->bytesAvailable() >=
                                m_encodingsPending * sizeof(quint32)) {
        for (int i = 0; i < m_encodingsPending; ++i) {
            qint32 enc;
            m_clientSocket->read((char *)&enc, sizeof(qint32));
            enc = ntohl(enc);
            qCDebug(lcVnc, "QVncServer::setEncodings: %d", enc);
            switch (enc) {
            case Raw:
                if (!m_encoder) {
                    m_encoder = new QRfbRawEncoder(this);
                    qCDebug(lcVnc, "QVncServer::setEncodings: using raw");
                }
               break;
            case CopyRect:
                m_supportCopyRect = true;
                break;
            case RRE:
                m_supportRRE = true;
                break;
            case CoRRE:
                m_supportCoRRE = true;
                break;
            case Hextile:
                m_supportHextile = true;
                if (m_encoder)
                    break;
                break;
            case ZRLE:
                m_supportZRLE = true;
                break;
            case Cursor:
                m_supportCursor = true;
                m_server->screen()->enableClientCursor(this);
                break;
            case DesktopSize:
                m_supportDesktopSize = true;
                break;
            default:
                break;
            }
        }
        m_handleMsg = false;
        m_encodingsPending = 0;
    }

    if (!m_encoder) {
        m_encoder = new QRfbRawEncoder(this);
        qCDebug(lcVnc, "QVncServer::setEncodings: fallback using raw");
    }
}